

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceUtils.cpp
# Opt level: O3

BlendEquationAdvanced sglr::rr_util::mapGLBlendEquationAdvanced(deUint32 equation)

{
  BlendEquationAdvanced BVar1;
  
  BVar1 = BLENDEQUATION_ADVANCED_LAST;
  if (equation - 0x9294 < 0x1d) {
    BVar1 = *(BlendEquationAdvanced *)(&DAT_01cbe624 + (ulong)(equation - 0x9294) * 4);
  }
  return BVar1;
}

Assistant:

rr::BlendEquationAdvanced mapGLBlendEquationAdvanced (deUint32 equation)
{
	switch (equation)
	{
		case GL_MULTIPLY_KHR:		return rr::BLENDEQUATION_ADVANCED_MULTIPLY;
		case GL_SCREEN_KHR:			return rr::BLENDEQUATION_ADVANCED_SCREEN;
		case GL_OVERLAY_KHR:		return rr::BLENDEQUATION_ADVANCED_OVERLAY;
		case GL_DARKEN_KHR:			return rr::BLENDEQUATION_ADVANCED_DARKEN;
		case GL_LIGHTEN_KHR:		return rr::BLENDEQUATION_ADVANCED_LIGHTEN;
		case GL_COLORDODGE_KHR:		return rr::BLENDEQUATION_ADVANCED_COLORDODGE;
		case GL_COLORBURN_KHR:		return rr::BLENDEQUATION_ADVANCED_COLORBURN;
		case GL_HARDLIGHT_KHR:		return rr::BLENDEQUATION_ADVANCED_HARDLIGHT;
		case GL_SOFTLIGHT_KHR:		return rr::BLENDEQUATION_ADVANCED_SOFTLIGHT;
		case GL_DIFFERENCE_KHR:		return rr::BLENDEQUATION_ADVANCED_DIFFERENCE;
		case GL_EXCLUSION_KHR:		return rr::BLENDEQUATION_ADVANCED_EXCLUSION;
		case GL_HSL_HUE_KHR:		return rr::BLENDEQUATION_ADVANCED_HSL_HUE;
		case GL_HSL_SATURATION_KHR:	return rr::BLENDEQUATION_ADVANCED_HSL_SATURATION;
		case GL_HSL_COLOR_KHR:		return rr::BLENDEQUATION_ADVANCED_HSL_COLOR;
		case GL_HSL_LUMINOSITY_KHR:	return rr::BLENDEQUATION_ADVANCED_HSL_LUMINOSITY;
		default:
			DE_ASSERT(false);
			return rr::BLENDEQUATION_ADVANCED_LAST;
	}
}